

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_sse2.c
# Opt level: O0

void av1_dist_wtd_convolve_2d_copy_sse2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               ConvolveParams *conv_params)

{
  char cVar1;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  longlong lVar21;
  longlong lVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined2 uVar27;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  int *in_stack_00000008;
  __m128i res_8_1;
  __m128i round_result;
  __m128i comp_avg_res;
  __m128i data_ref_0;
  __m128i res_unsigned;
  __m128i res;
  __m128i d16_0;
  __m128i d8_1;
  __m128i res_8;
  __m128i round_result_hi;
  __m128i comp_avg_res_hi;
  __m128i round_result_lo;
  __m128i comp_avg_res_lo;
  __m128i data_ref_0_hi;
  __m128i data_ref_0_lo;
  __m128i res_unsigned_hi;
  __m128i res_hi;
  __m128i res_unsigned_lo;
  __m128i res_lo;
  __m128i d16_hi;
  __m128i d16_lo;
  __m128i d8;
  __m128i rounding_const;
  int rounding_shift;
  __m128i offset_const;
  int offset;
  int offset_0;
  __m128i wt;
  __m128i wt1;
  __m128i wt0;
  int w1;
  int w0;
  int j;
  int i;
  __m128i left_shift;
  __m128i zero;
  int use_dist_wtd_comp_avg;
  int do_average;
  int bits;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  int bd;
  undefined2 in_stack_fffffffffffffa78;
  undefined2 uVar28;
  undefined2 uVar29;
  undefined1 in_stack_fffffffffffffa7e;
  byte bVar30;
  undefined4 uVar31;
  undefined2 uVar32;
  char in_stack_fffffffffffffa88;
  char in_stack_fffffffffffffa89;
  char in_stack_fffffffffffffa8a;
  char in_stack_fffffffffffffa8b;
  char in_stack_fffffffffffffa8c;
  char in_stack_fffffffffffffa8d;
  char in_stack_fffffffffffffa8e;
  char in_stack_fffffffffffffa8f;
  longlong local_558 [2];
  undefined8 local_548;
  undefined8 uStack_540;
  short local_538;
  short sStack_536;
  short sStack_534;
  short sStack_532;
  short sStack_530;
  short sStack_52e;
  short sStack_52c;
  short sStack_52a;
  undefined1 local_528 [16];
  undefined1 local_518;
  undefined1 uStack_517;
  undefined1 uStack_516;
  undefined1 uStack_515;
  undefined1 uStack_514;
  undefined1 uStack_513;
  undefined1 uStack_512;
  undefined1 uStack_511;
  undefined1 uStack_510;
  undefined1 uStack_50f;
  undefined1 uStack_50e;
  undefined1 uStack_50d;
  undefined1 uStack_50c;
  undefined1 uStack_50b;
  undefined1 uStack_50a;
  undefined1 uStack_509;
  undefined8 local_508;
  undefined8 uStack_500;
  char local_4f8;
  char cStack_4f7;
  char cStack_4f6;
  char cStack_4f5;
  char cStack_4f4;
  char cStack_4f3;
  char cStack_4f2;
  char cStack_4f1;
  char cStack_4f0;
  char cStack_4ef;
  char cStack_4ee;
  char cStack_4ed;
  char cStack_4ec;
  char cStack_4eb;
  char cStack_4ea;
  char cStack_4e9;
  longlong local_4d8 [2];
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  longlong local_4b8 [2];
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  short local_488;
  short sStack_486;
  short sStack_484;
  short sStack_482;
  short sStack_480;
  short sStack_47e;
  short sStack_47c;
  short sStack_47a;
  undefined1 local_478 [16];
  short local_468;
  short sStack_466;
  short sStack_464;
  short sStack_462;
  short sStack_460;
  short sStack_45e;
  short sStack_45c;
  short sStack_45a;
  undefined1 local_458 [16];
  undefined1 local_448;
  undefined1 uStack_447;
  undefined1 uStack_446;
  undefined1 uStack_445;
  undefined1 uStack_444;
  undefined1 uStack_443;
  undefined1 uStack_442;
  undefined1 uStack_441;
  undefined1 uStack_440;
  undefined1 uStack_43f;
  undefined1 uStack_43e;
  undefined1 uStack_43d;
  undefined1 uStack_43c;
  undefined1 uStack_43b;
  undefined1 uStack_43a;
  undefined1 uStack_439;
  undefined1 local_438;
  undefined1 uStack_437;
  undefined1 uStack_436;
  undefined1 uStack_435;
  undefined1 uStack_434;
  undefined1 uStack_433;
  undefined1 uStack_432;
  undefined1 uStack_431;
  undefined1 uStack_430;
  undefined1 uStack_42f;
  undefined1 uStack_42e;
  undefined1 uStack_42d;
  undefined1 uStack_42c;
  undefined1 uStack_42b;
  undefined1 uStack_42a;
  undefined1 uStack_429;
  undefined8 local_428;
  undefined8 uStack_420;
  longlong local_418;
  longlong lStack_410;
  int local_3fc;
  longlong local_3f8;
  longlong lStack_3f0;
  int local_3e0;
  int local_3dc;
  undefined2 local_3d8;
  undefined2 uStack_3d6;
  undefined2 uStack_3d4;
  undefined2 uStack_3d2;
  undefined2 uStack_3d0;
  undefined2 uStack_3ce;
  undefined2 uStack_3cc;
  undefined2 uStack_3ca;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  int local_3a8;
  int local_3a4;
  int local_3a0;
  int local_39c;
  ulong local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  int local_378;
  int local_374;
  uint local_370;
  int local_36c;
  long local_368;
  undefined4 local_360;
  int local_35c;
  int local_358;
  int local_354;
  long local_350;
  int local_344;
  long local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined8 *local_318;
  undefined8 *local_310;
  undefined1 local_308 [16];
  uint local_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_26a;
  short local_268;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_260;
  short sStack_25e;
  short sStack_25c;
  short sStack_25a;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_218;
  undefined2 local_210;
  undefined2 local_20e;
  undefined2 local_20c;
  undefined2 local_20a;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  ulong local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  ulong local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ulong local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  longlong local_168;
  longlong lStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined2 local_78;
  undefined2 local_76;
  undefined2 local_74;
  undefined2 local_72;
  undefined2 local_70;
  undefined2 local_6e;
  undefined2 local_6c;
  undefined2 local_6a;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined2 local_58;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  longlong local_48;
  longlong lStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  longlong local_28;
  longlong lStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  
  local_360 = 8;
  local_368 = *(long *)(in_stack_00000008 + 2);
  local_36c = in_stack_00000008[4];
  uVar31 = 0xe;
  local_370 = 0xe - (in_stack_00000008[6] + in_stack_00000008[5]);
  local_374 = *in_stack_00000008;
  local_378 = in_stack_00000008[9];
  local_338 = 0;
  uStack_330 = 0;
  local_388 = 0;
  uStack_380 = 0;
  local_308._4_4_ = 0;
  local_308._0_4_ = local_370;
  local_398 = local_308._0_8_;
  uStack_390 = 0;
  local_3a4 = in_stack_00000008[10];
  local_3a8 = in_stack_00000008[0xb];
  local_20a = (undefined2)local_3a4;
  local_6a = (undefined2)local_3a4;
  local_6c = (undefined2)local_3a4;
  local_6e = (undefined2)local_3a4;
  local_70 = (undefined2)local_3a4;
  local_72 = (undefined2)local_3a4;
  local_74 = (undefined2)local_3a4;
  local_76 = (undefined2)local_3a4;
  local_78 = (undefined2)local_3a4;
  local_3b8 = CONCAT26((undefined2)local_3a4,
                       CONCAT24((undefined2)local_3a4,
                                CONCAT22((undefined2)local_3a4,(undefined2)local_3a4)));
  uStack_3b0 = CONCAT26((undefined2)local_3a4,
                        CONCAT24((undefined2)local_3a4,
                                 CONCAT22((undefined2)local_3a4,(undefined2)local_3a4)));
  local_20c = (undefined2)local_3a8;
  local_4a = (undefined2)local_3a8;
  local_4c = (undefined2)local_3a8;
  local_4e = (undefined2)local_3a8;
  local_50 = (undefined2)local_3a8;
  local_52 = (undefined2)local_3a8;
  local_54 = (undefined2)local_3a8;
  local_56 = (undefined2)local_3a8;
  local_58 = (undefined2)local_3a8;
  local_3c8 = CONCAT26((undefined2)local_3a8,
                       CONCAT24((undefined2)local_3a8,
                                CONCAT22((undefined2)local_3a8,(undefined2)local_3a8)));
  uStack_3c0 = CONCAT26((undefined2)local_3a8,
                        CONCAT24((undefined2)local_3a8,
                                 CONCAT22((undefined2)local_3a8,(undefined2)local_3a8)));
  local_3d8 = (undefined2)local_3a4;
  uStack_3d6 = (undefined2)local_3a8;
  uStack_3d4 = (undefined2)local_3a4;
  uStack_3d2 = (undefined2)local_3a8;
  uStack_3d0 = (undefined2)local_3a4;
  uStack_3ce = (undefined2)local_3a8;
  uStack_3cc = (undefined2)local_3a4;
  uStack_3ca = (undefined2)local_3a8;
  local_3dc = 0x16 - (in_stack_00000008[5] + in_stack_00000008[6]);
  local_3e0 = (1 << ((byte)local_3dc & 0x1f)) + (1 << ((byte)local_3dc - 1 & 0x1f));
  local_20e = (undefined2)local_3e0;
  local_2a = (undefined2)local_3e0;
  local_2c = (undefined2)local_3e0;
  local_2e = (undefined2)local_3e0;
  local_30 = (undefined2)local_3e0;
  local_32 = (undefined2)local_3e0;
  local_34 = (undefined2)local_3e0;
  local_36 = (undefined2)local_3e0;
  local_38 = (undefined2)local_3e0;
  local_3f8 = CONCAT26((undefined2)local_3e0,
                       CONCAT24((undefined2)local_3e0,
                                CONCAT22((undefined2)local_3e0,(undefined2)local_3e0)));
  lStack_3f0 = CONCAT26((undefined2)local_3e0,
                        CONCAT24((undefined2)local_3e0,
                                 CONCAT22((undefined2)local_3e0,(undefined2)local_3e0)));
  local_3fc = 0xe - (in_stack_00000008[5] + in_stack_00000008[6]);
  uVar27 = (undefined2)((uint)(1 << ((byte)local_3fc & 0x1f)) >> 1);
  local_418 = CONCAT26(uVar27,CONCAT24(uVar27,CONCAT22(uVar27,uVar27)));
  lStack_410 = CONCAT26(uVar27,CONCAT24(uVar27,CONCAT22(uVar27,uVar27)));
  local_35c = in_R9D;
  local_358 = in_R8D;
  local_354 = in_ECX;
  local_350 = in_RDX;
  local_344 = in_ESI;
  local_340 = in_RDI;
  local_308 = ZEXT416(local_370);
  local_2ec = local_370;
  local_2a8 = local_3c8;
  uStack_2a0 = uStack_3c0;
  local_298 = local_3b8;
  uStack_290 = uStack_3b0;
  local_210 = uVar27;
  local_88 = local_3b8;
  uStack_80 = uStack_3b0;
  local_68 = local_3c8;
  uStack_60 = uStack_3c0;
  local_48 = local_3f8;
  lStack_40 = lStack_3f0;
  local_28 = local_418;
  lStack_20 = lStack_410;
  local_10 = uVar27;
  local_e = uVar27;
  local_c = uVar27;
  local_a = uVar27;
  local_8 = uVar27;
  local_6 = uVar27;
  local_4 = uVar27;
  local_2 = uVar27;
  if (in_R8D % 0x10 == 0) {
    uVar28 = (undefined2)local_3a4;
    uVar29 = (undefined2)local_3a8;
    bVar30 = (byte)local_3dc;
    uVar32 = (undefined2)local_3e0;
    for (local_39c = 0; local_39c < local_35c; local_39c = local_39c + 1) {
      for (local_3a0 = 0; local_3a0 < local_358; local_3a0 = local_3a0 + 0x10) {
        local_310 = (undefined8 *)(local_340 + local_3a0);
        local_428 = *local_310;
        uStack_420 = local_310[1];
        local_2c8 = local_388;
        uVar19 = local_2c8;
        uStack_2c0 = uStack_380;
        local_2b8._0_1_ = (undefined1)local_428;
        local_2b8._1_1_ = (undefined1)((ulong)local_428 >> 8);
        local_2b8._2_1_ = (undefined1)((ulong)local_428 >> 0x10);
        local_2b8._3_1_ = (undefined1)((ulong)local_428 >> 0x18);
        local_2b8._4_1_ = (undefined1)((ulong)local_428 >> 0x20);
        local_2b8._5_1_ = (undefined1)((ulong)local_428 >> 0x28);
        local_2b8._6_1_ = (undefined1)((ulong)local_428 >> 0x30);
        local_2b8._7_1_ = (undefined1)((ulong)local_428 >> 0x38);
        local_2c8._0_1_ = (undefined1)local_388;
        local_2c8._1_1_ = (undefined1)((ulong)local_388 >> 8);
        local_2c8._2_1_ = (undefined1)((ulong)local_388 >> 0x10);
        local_2c8._3_1_ = (undefined1)((ulong)local_388 >> 0x18);
        local_2c8._4_1_ = (undefined1)((ulong)local_388 >> 0x20);
        local_2c8._5_1_ = (undefined1)((ulong)local_388 >> 0x28);
        local_2c8._6_1_ = (undefined1)((ulong)local_388 >> 0x30);
        local_2c8._7_1_ = (undefined1)((ulong)local_388 >> 0x38);
        local_438 = (undefined1)local_2b8;
        uStack_437 = (undefined1)local_2c8;
        uStack_436 = local_2b8._1_1_;
        uStack_435 = local_2c8._1_1_;
        uStack_434 = local_2b8._2_1_;
        uStack_433 = local_2c8._2_1_;
        uStack_432 = local_2b8._3_1_;
        uStack_431 = local_2c8._3_1_;
        uStack_430 = local_2b8._4_1_;
        uStack_42f = local_2c8._4_1_;
        uStack_42e = local_2b8._5_1_;
        uStack_42d = local_2c8._5_1_;
        uStack_42c = local_2b8._6_1_;
        uStack_42b = local_2c8._6_1_;
        uStack_42a = local_2b8._7_1_;
        uStack_429 = local_2c8._7_1_;
        local_208 = local_388;
        uStack_200 = uStack_380;
        uVar20 = uStack_200;
        uStack_1f0._0_1_ = (undefined1)uStack_420;
        uStack_1f0._1_1_ = (undefined1)((ulong)uStack_420 >> 8);
        uStack_1f0._2_1_ = (undefined1)((ulong)uStack_420 >> 0x10);
        uStack_1f0._3_1_ = (undefined1)((ulong)uStack_420 >> 0x18);
        uStack_1f0._4_1_ = (undefined1)((ulong)uStack_420 >> 0x20);
        uStack_1f0._5_1_ = (undefined1)((ulong)uStack_420 >> 0x28);
        uStack_1f0._6_1_ = (undefined1)((ulong)uStack_420 >> 0x30);
        uStack_1f0._7_1_ = (undefined1)((ulong)uStack_420 >> 0x38);
        uStack_200._0_1_ = (undefined1)uStack_380;
        uStack_200._1_1_ = (undefined1)((ulong)uStack_380 >> 8);
        uStack_200._2_1_ = (undefined1)((ulong)uStack_380 >> 0x10);
        uStack_200._3_1_ = (undefined1)((ulong)uStack_380 >> 0x18);
        uStack_200._4_1_ = (undefined1)((ulong)uStack_380 >> 0x20);
        uStack_200._5_1_ = (undefined1)((ulong)uStack_380 >> 0x28);
        uStack_200._6_1_ = (undefined1)((ulong)uStack_380 >> 0x30);
        uStack_200._7_1_ = (undefined1)((ulong)uStack_380 >> 0x38);
        local_448 = (undefined1)uStack_1f0;
        uStack_447 = (undefined1)uStack_200;
        uStack_446 = uStack_1f0._1_1_;
        uStack_445 = uStack_200._1_1_;
        uStack_444 = uStack_1f0._2_1_;
        uStack_443 = uStack_200._2_1_;
        uStack_442 = uStack_1f0._3_1_;
        uStack_441 = uStack_200._3_1_;
        uStack_440 = uStack_1f0._4_1_;
        uStack_43f = uStack_200._4_1_;
        uStack_43e = uStack_1f0._5_1_;
        uStack_43d = uStack_200._5_1_;
        uStack_43c = uStack_1f0._6_1_;
        uStack_43b = uStack_200._6_1_;
        uStack_43a = uStack_1f0._7_1_;
        uStack_439 = uStack_200._7_1_;
        local_198 = CONCAT17(local_2c8._3_1_,
                             CONCAT16(local_2b8._3_1_,
                                      CONCAT15(local_2c8._2_1_,
                                               CONCAT14(local_2b8._2_1_,
                                                        CONCAT13(local_2c8._1_1_,
                                                                 CONCAT12(local_2b8._1_1_,
                                                                          CONCAT11((undefined1)
                                                                                   local_2c8,
                                                                                   (undefined1)
                                                                                   local_2b8)))))));
        uStack_190 = CONCAT17(local_2c8._7_1_,
                              CONCAT16(local_2b8._7_1_,
                                       CONCAT15(local_2c8._6_1_,
                                                CONCAT14(local_2b8._6_1_,
                                                         CONCAT13(local_2c8._5_1_,
                                                                  CONCAT12(local_2b8._5_1_,
                                                                           CONCAT11(local_2c8._4_1_,
                                                                                    local_2b8._4_1_)
                                                                          ))))));
        local_1a8 = local_398;
        uStack_1a0 = uStack_390;
        auVar18._8_8_ = uStack_190;
        auVar18._0_8_ = local_198;
        auVar17._8_8_ = uStack_390;
        auVar17._0_8_ = local_398;
        local_458 = psllw(auVar18,auVar17);
        local_138 = local_458._0_8_;
        uVar25 = local_138;
        uStack_130 = local_458._8_8_;
        uVar26 = uStack_130;
        local_148 = local_3f8;
        lVar21 = local_148;
        uStack_140 = lStack_3f0;
        lVar22 = uStack_140;
        local_138._0_2_ = local_458._0_2_;
        local_138._2_2_ = local_458._2_2_;
        local_138._4_2_ = local_458._4_2_;
        local_138._6_2_ = local_458._6_2_;
        uStack_130._0_2_ = local_458._8_2_;
        uStack_130._2_2_ = local_458._10_2_;
        uStack_130._4_2_ = local_458._12_2_;
        uStack_130._6_2_ = local_458._14_2_;
        local_148._0_2_ = (short)local_3f8;
        local_148._2_2_ = (short)((ulong)local_3f8 >> 0x10);
        local_148._4_2_ = (short)((ulong)local_3f8 >> 0x20);
        local_148._6_2_ = (short)((ulong)local_3f8 >> 0x30);
        uStack_140._0_2_ = (short)lStack_3f0;
        uStack_140._2_2_ = (short)((ulong)lStack_3f0 >> 0x10);
        uStack_140._4_2_ = (short)((ulong)lStack_3f0 >> 0x20);
        uStack_140._6_2_ = (short)((ulong)lStack_3f0 >> 0x30);
        local_468 = (short)local_138 + (short)local_148;
        sStack_466 = local_138._2_2_ + local_148._2_2_;
        sStack_464 = local_138._4_2_ + local_148._4_2_;
        sStack_462 = local_138._6_2_ + local_148._6_2_;
        sStack_460 = (short)uStack_130 + (short)uStack_140;
        sStack_45e = uStack_130._2_2_ + uStack_140._2_2_;
        sStack_45c = uStack_130._4_2_ + uStack_140._4_2_;
        sStack_45a = uStack_130._6_2_ + uStack_140._6_2_;
        local_1b8 = CONCAT17(uStack_200._3_1_,
                             CONCAT16(uStack_1f0._3_1_,
                                      CONCAT15(uStack_200._2_1_,
                                               CONCAT14(uStack_1f0._2_1_,
                                                        CONCAT13(uStack_200._1_1_,
                                                                 CONCAT12(uStack_1f0._1_1_,
                                                                          CONCAT11((undefined1)
                                                                                   uStack_200,
                                                                                   (undefined1)
                                                                                   uStack_1f0)))))))
        ;
        uStack_1b0 = CONCAT17(uStack_200._7_1_,
                              CONCAT16(uStack_1f0._7_1_,
                                       CONCAT15(uStack_200._6_1_,
                                                CONCAT14(uStack_1f0._6_1_,
                                                         CONCAT13(uStack_200._5_1_,
                                                                  CONCAT12(uStack_1f0._5_1_,
                                                                           CONCAT11(uStack_200._4_1_
                                                                                    ,uStack_1f0.
                                                                                     _4_1_)))))));
        local_1c8 = local_398;
        uStack_1c0 = uStack_390;
        auVar16._8_8_ = uStack_1b0;
        auVar16._0_8_ = local_1b8;
        auVar15._8_8_ = uStack_390;
        auVar15._0_8_ = local_398;
        local_478 = psllw(auVar16,auVar15);
        local_158 = local_478._0_8_;
        uVar23 = local_158;
        uStack_150 = local_478._8_8_;
        uVar24 = uStack_150;
        local_168 = local_3f8;
        lStack_160 = lStack_3f0;
        local_158._0_2_ = local_478._0_2_;
        local_158._2_2_ = local_478._2_2_;
        local_158._4_2_ = local_478._4_2_;
        local_158._6_2_ = local_478._6_2_;
        uStack_150._0_2_ = local_478._8_2_;
        uStack_150._2_2_ = local_478._10_2_;
        uStack_150._4_2_ = local_478._12_2_;
        uStack_150._6_2_ = local_478._14_2_;
        local_488 = (short)local_158 + (short)local_148;
        sStack_486 = local_158._2_2_ + local_148._2_2_;
        sStack_484 = local_158._4_2_ + local_148._4_2_;
        sStack_482 = local_158._6_2_ + local_148._6_2_;
        sStack_480 = (short)uStack_150 + (short)uStack_140;
        sStack_47e = uStack_150._2_2_ + uStack_140._2_2_;
        sStack_47c = uStack_150._4_2_ + uStack_140._4_2_;
        sStack_47a = uStack_150._6_2_ + uStack_140._6_2_;
        if (local_374 == 0) {
          local_d0 = (undefined8 *)(local_368 + (long)local_3a0 * 2);
          local_e8 = CONCAT26(sStack_462,CONCAT24(sStack_464,CONCAT22(sStack_466,local_468)));
          uStack_e0 = CONCAT26(sStack_45a,CONCAT24(sStack_45c,CONCAT22(sStack_45e,sStack_460)));
          *local_d0 = local_e8;
          local_d0[1] = uStack_e0;
          local_f0 = (undefined8 *)(local_368 + (long)(local_3a0 + 8) * 2);
          local_108 = CONCAT26(sStack_482,CONCAT24(sStack_484,CONCAT22(sStack_486,local_488)));
          uStack_100 = CONCAT26(sStack_47a,CONCAT24(sStack_47c,CONCAT22(sStack_47e,sStack_480)));
          *local_f0 = local_108;
          local_f0[1] = uStack_100;
        }
        else {
          local_318 = (undefined8 *)(local_368 + (long)local_3a0 * 2);
          local_498 = *local_318;
          uStack_490 = local_318[1];
          local_320 = (undefined8 *)(local_368 + (long)(local_3a0 + 8) * 2);
          local_4a8 = *local_320;
          uStack_4a0 = local_320[1];
          local_2c8 = uVar19;
          local_2b8 = local_428;
          uStack_2b0 = uStack_420;
          uStack_200 = uVar20;
          local_1f8 = local_428;
          uStack_1f0 = uStack_420;
          local_158 = uVar23;
          uStack_150 = uVar24;
          local_148 = lVar21;
          uStack_140 = lVar22;
          local_138 = uVar25;
          uStack_130 = uVar26;
          comp_avg((__m128i *)
                   CONCAT17(in_stack_fffffffffffffa8f,
                            CONCAT16(in_stack_fffffffffffffa8e,
                                     CONCAT15(in_stack_fffffffffffffa8d,
                                              CONCAT14(in_stack_fffffffffffffa8c,
                                                       CONCAT13(in_stack_fffffffffffffa8b,
                                                                CONCAT12(in_stack_fffffffffffffa8a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffa89,
                                                  in_stack_fffffffffffffa88))))))),
                   (__m128i *)CONCAT26(uVar27,CONCAT24(uVar32,uVar31)),
                   (__m128i *)
                   CONCAT17(bVar30,CONCAT16(in_stack_fffffffffffffa7e,
                                            CONCAT24(uVar29,CONCAT22(uVar28,
                                                  in_stack_fffffffffffffa78)))),0);
          convolve_rounding(&local_4b8,(__m128i *)&local_3f8,(__m128i *)&local_418,local_3fc);
          local_4c8 = extraout_XMM0_Qa;
          uStack_4c0 = extraout_XMM0_Qb;
          comp_avg((__m128i *)
                   CONCAT17(in_stack_fffffffffffffa8f,
                            CONCAT16(in_stack_fffffffffffffa8e,
                                     CONCAT15(in_stack_fffffffffffffa8d,
                                              CONCAT14(in_stack_fffffffffffffa8c,
                                                       CONCAT13(in_stack_fffffffffffffa8b,
                                                                CONCAT12(in_stack_fffffffffffffa8a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffa89,
                                                  in_stack_fffffffffffffa88))))))),
                   (__m128i *)CONCAT26(uVar27,CONCAT24(uVar32,uVar31)),
                   (__m128i *)
                   CONCAT17(bVar30,CONCAT16(in_stack_fffffffffffffa7e,
                                            CONCAT24(uVar29,CONCAT22(uVar28,
                                                  in_stack_fffffffffffffa78)))),0);
          convolve_rounding(&local_4d8,(__m128i *)&local_3f8,(__m128i *)&local_418,local_3fc);
          local_258 = local_4c8;
          uVar19 = local_258;
          uStack_250 = uStack_4c0;
          uVar20 = uStack_250;
          local_258._0_2_ = (short)local_4c8;
          local_258._2_2_ = (short)((ulong)local_4c8 >> 0x10);
          local_258._4_2_ = (short)((ulong)local_4c8 >> 0x20);
          local_258._6_2_ = (short)((ulong)local_4c8 >> 0x30);
          uStack_250._0_2_ = (short)uStack_4c0;
          uStack_250._2_2_ = (short)((ulong)uStack_4c0 >> 0x10);
          uStack_250._4_2_ = (short)((ulong)uStack_4c0 >> 0x20);
          uStack_250._6_2_ = (short)((ulong)uStack_4c0 >> 0x30);
          local_268 = (short)extraout_XMM0_Qa_00;
          sStack_266 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
          sStack_264 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
          sStack_262 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
          sStack_260 = (short)extraout_XMM0_Qb_00;
          sStack_25e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
          sStack_25c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
          sStack_25a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
          local_4f8 = (0 < (short)local_258) * ((short)local_258 < 0x100) * (char)local_4c8 -
                      (0xff < (short)local_258);
          cStack_4f7 = (0 < local_258._2_2_) * (local_258._2_2_ < 0x100) *
                       (char)((ulong)local_4c8 >> 0x10) - (0xff < local_258._2_2_);
          cStack_4f6 = (0 < local_258._4_2_) * (local_258._4_2_ < 0x100) *
                       (char)((ulong)local_4c8 >> 0x20) - (0xff < local_258._4_2_);
          cStack_4f5 = (0 < local_258._6_2_) * (local_258._6_2_ < 0x100) *
                       (char)((ulong)local_4c8 >> 0x30) - (0xff < local_258._6_2_);
          cStack_4f4 = (0 < (short)uStack_250) * ((short)uStack_250 < 0x100) * (char)uStack_4c0 -
                       (0xff < (short)uStack_250);
          cStack_4f3 = (0 < uStack_250._2_2_) * (uStack_250._2_2_ < 0x100) *
                       (char)((ulong)uStack_4c0 >> 0x10) - (0xff < uStack_250._2_2_);
          cStack_4f2 = (0 < uStack_250._4_2_) * (uStack_250._4_2_ < 0x100) *
                       (char)((ulong)uStack_4c0 >> 0x20) - (0xff < uStack_250._4_2_);
          cStack_4f1 = (0 < uStack_250._6_2_) * (uStack_250._6_2_ < 0x100) *
                       (char)((ulong)uStack_4c0 >> 0x30) - (0xff < uStack_250._6_2_);
          cStack_4f0 = (0 < local_268) * (local_268 < 0x100) * (char)extraout_XMM0_Qa_00 -
                       (0xff < local_268);
          cStack_4ef = (0 < sStack_266) * (sStack_266 < 0x100) *
                       (char)((ulong)extraout_XMM0_Qa_00 >> 0x10) - (0xff < sStack_266);
          cStack_4ee = (0 < sStack_264) * (sStack_264 < 0x100) *
                       (char)((ulong)extraout_XMM0_Qa_00 >> 0x20) - (0xff < sStack_264);
          cStack_4ed = (0 < sStack_262) * (sStack_262 < 0x100) *
                       (char)((ulong)extraout_XMM0_Qa_00 >> 0x30) - (0xff < sStack_262);
          cStack_4ec = (0 < sStack_260) * (sStack_260 < 0x100) * (char)extraout_XMM0_Qb_00 -
                       (0xff < sStack_260);
          cStack_4eb = (0 < sStack_25e) * (sStack_25e < 0x100) *
                       (char)((ulong)extraout_XMM0_Qb_00 >> 0x10) - (0xff < sStack_25e);
          cStack_4ea = (0 < sStack_25c) * (sStack_25c < 0x100) *
                       (char)((ulong)extraout_XMM0_Qb_00 >> 0x20) - (0xff < sStack_25c);
          cStack_4e9 = (0 < sStack_25a) * (sStack_25a < 0x100) *
                       (char)((ulong)extraout_XMM0_Qb_00 >> 0x30) - (0xff < sStack_25a);
          local_b0 = (undefined8 *)(local_350 + local_3a0);
          local_c8 = CONCAT17(cStack_4f1,
                              CONCAT16(cStack_4f2,
                                       CONCAT15(cStack_4f3,
                                                CONCAT14(cStack_4f4,
                                                         CONCAT13(cStack_4f5,
                                                                  CONCAT12(cStack_4f6,
                                                                           CONCAT11(cStack_4f7,
                                                                                    local_4f8)))))))
          ;
          uStack_c0 = CONCAT17(cStack_4e9,
                               CONCAT16(cStack_4ea,
                                        CONCAT15(cStack_4eb,
                                                 CONCAT14(cStack_4ec,
                                                          CONCAT13(cStack_4ed,
                                                                   CONCAT12(cStack_4ee,
                                                                            CONCAT11(cStack_4ef,
                                                                                     cStack_4f0)))))
                                       ));
          *local_b0 = local_c8;
          local_b0[1] = uStack_c0;
          local_258 = uVar19;
          uStack_250 = uVar20;
        }
      }
      local_340 = local_340 + local_344;
      local_368 = local_368 + (long)local_36c * 2;
      local_350 = local_350 + local_354;
    }
  }
  else {
    uVar28 = (undefined2)local_3a4;
    uVar29 = (undefined2)local_3a8;
    bVar30 = (byte)local_3dc;
    uVar32 = (undefined2)local_3e0;
    for (local_39c = 0; local_39c < local_35c; local_39c = local_39c + 1) {
      for (local_3a0 = 0; local_3a0 < local_358; local_3a0 = local_3a0 + 8) {
        local_90 = (undefined8 *)(local_340 + local_3a0);
        local_508 = *local_90;
        uStack_a0 = 0;
        uStack_500 = 0;
        uStack_2d0 = 0;
        local_2e8 = local_388;
        uVar19 = local_2e8;
        uStack_2e0 = uStack_380;
        local_2d8._0_1_ = (undefined1)local_508;
        local_2d8._1_1_ = (undefined1)((ulong)local_508 >> 8);
        local_2d8._2_1_ = (undefined1)((ulong)local_508 >> 0x10);
        local_2d8._3_1_ = (undefined1)((ulong)local_508 >> 0x18);
        local_2d8._4_1_ = (undefined1)((ulong)local_508 >> 0x20);
        local_2d8._5_1_ = (undefined1)((ulong)local_508 >> 0x28);
        local_2d8._6_1_ = (undefined1)((ulong)local_508 >> 0x30);
        local_2d8._7_1_ = (undefined1)((ulong)local_508 >> 0x38);
        local_2e8._0_1_ = (undefined1)local_388;
        local_2e8._1_1_ = (undefined1)((ulong)local_388 >> 8);
        local_2e8._2_1_ = (undefined1)((ulong)local_388 >> 0x10);
        local_2e8._3_1_ = (undefined1)((ulong)local_388 >> 0x18);
        local_2e8._4_1_ = (undefined1)((ulong)local_388 >> 0x20);
        local_2e8._5_1_ = (undefined1)((ulong)local_388 >> 0x28);
        local_2e8._6_1_ = (undefined1)((ulong)local_388 >> 0x30);
        local_2e8._7_1_ = (undefined1)((ulong)local_388 >> 0x38);
        local_518 = (undefined1)local_2d8;
        uStack_517 = (undefined1)local_2e8;
        uStack_516 = local_2d8._1_1_;
        uStack_515 = local_2e8._1_1_;
        uStack_514 = local_2d8._2_1_;
        uStack_513 = local_2e8._2_1_;
        uStack_512 = local_2d8._3_1_;
        uStack_511 = local_2e8._3_1_;
        uStack_510 = local_2d8._4_1_;
        uStack_50f = local_2e8._4_1_;
        uStack_50e = local_2d8._5_1_;
        uStack_50d = local_2e8._5_1_;
        uStack_50c = local_2d8._6_1_;
        uStack_50b = local_2e8._6_1_;
        uStack_50a = local_2d8._7_1_;
        uStack_509 = local_2e8._7_1_;
        local_1d8 = CONCAT17(local_2e8._3_1_,
                             CONCAT16(local_2d8._3_1_,
                                      CONCAT15(local_2e8._2_1_,
                                               CONCAT14(local_2d8._2_1_,
                                                        CONCAT13(local_2e8._1_1_,
                                                                 CONCAT12(local_2d8._1_1_,
                                                                          CONCAT11((undefined1)
                                                                                   local_2e8,
                                                                                   (undefined1)
                                                                                   local_2d8)))))));
        uStack_1d0 = CONCAT17(local_2e8._7_1_,
                              CONCAT16(local_2d8._7_1_,
                                       CONCAT15(local_2e8._6_1_,
                                                CONCAT14(local_2d8._6_1_,
                                                         CONCAT13(local_2e8._5_1_,
                                                                  CONCAT12(local_2d8._5_1_,
                                                                           CONCAT11(local_2e8._4_1_,
                                                                                    local_2d8._4_1_)
                                                                          ))))));
        local_1e8 = local_398;
        uStack_1e0 = uStack_390;
        auVar14._8_8_ = uStack_1d0;
        auVar14._0_8_ = local_1d8;
        auVar13._8_8_ = uStack_390;
        auVar13._0_8_ = local_398;
        local_528 = psllw(auVar14,auVar13);
        local_178 = local_528._0_8_;
        uVar20 = local_178;
        uStack_170 = local_528._8_8_;
        uVar23 = uStack_170;
        local_188 = local_3f8;
        lVar21 = local_188;
        uStack_180 = lStack_3f0;
        lVar22 = uStack_180;
        local_178._0_2_ = local_528._0_2_;
        local_178._2_2_ = local_528._2_2_;
        local_178._4_2_ = local_528._4_2_;
        local_178._6_2_ = local_528._6_2_;
        uStack_170._0_2_ = local_528._8_2_;
        uStack_170._2_2_ = local_528._10_2_;
        uStack_170._4_2_ = local_528._12_2_;
        uStack_170._6_2_ = local_528._14_2_;
        local_188._0_2_ = (short)local_3f8;
        local_188._2_2_ = (short)((ulong)local_3f8 >> 0x10);
        local_188._4_2_ = (short)((ulong)local_3f8 >> 0x20);
        local_188._6_2_ = (short)((ulong)local_3f8 >> 0x30);
        uStack_180._0_2_ = (short)lStack_3f0;
        uStack_180._2_2_ = (short)((ulong)lStack_3f0 >> 0x10);
        uStack_180._4_2_ = (short)((ulong)lStack_3f0 >> 0x20);
        uStack_180._6_2_ = (short)((ulong)lStack_3f0 >> 0x30);
        local_538 = (short)local_178 + (short)local_188;
        sStack_536 = local_178._2_2_ + local_188._2_2_;
        sStack_534 = local_178._4_2_ + local_188._4_2_;
        sStack_532 = local_178._6_2_ + local_188._6_2_;
        sStack_530 = (short)uStack_170 + (short)uStack_180;
        sStack_52e = uStack_170._2_2_ + uStack_180._2_2_;
        sStack_52c = uStack_170._4_2_ + uStack_180._4_2_;
        sStack_52a = uStack_170._6_2_ + uStack_180._6_2_;
        if (local_374 == 0) {
          local_110 = (undefined8 *)(local_368 + (long)local_3a0 * 2);
          local_128 = CONCAT26(sStack_532,CONCAT24(sStack_534,CONCAT22(sStack_536,local_538)));
          uStack_120 = CONCAT26(sStack_52a,CONCAT24(sStack_52c,CONCAT22(sStack_52e,sStack_530)));
          *local_110 = local_128;
          local_110[1] = uStack_120;
        }
        else {
          local_328 = (undefined8 *)(local_368 + (long)local_3a0 * 2);
          local_548 = *local_328;
          uStack_540 = local_328[1];
          local_2e8 = uVar19;
          local_2d8 = local_508;
          local_188 = lVar21;
          uStack_180 = lVar22;
          local_178 = uVar20;
          uStack_170 = uVar23;
          local_a8 = local_508;
          comp_avg((__m128i *)
                   CONCAT17(in_stack_fffffffffffffa8f,
                            CONCAT16(in_stack_fffffffffffffa8e,
                                     CONCAT15(in_stack_fffffffffffffa8d,
                                              CONCAT14(in_stack_fffffffffffffa8c,
                                                       CONCAT13(in_stack_fffffffffffffa8b,
                                                                CONCAT12(in_stack_fffffffffffffa8a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffa89,
                                                  in_stack_fffffffffffffa88))))))),
                   (__m128i *)CONCAT26(uVar27,CONCAT24(uVar32,uVar31)),
                   (__m128i *)
                   CONCAT17(bVar30,CONCAT16(in_stack_fffffffffffffa7e,
                                            CONCAT24(uVar29,CONCAT22(uVar28,
                                                  in_stack_fffffffffffffa78)))),0);
          convolve_rounding(&local_558,(__m128i *)&local_3f8,(__m128i *)&local_418,local_3fc);
          local_278 = (short)extraout_XMM0_Qa_01;
          sStack_276 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x10);
          sStack_274 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x20);
          sStack_272 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x30);
          sStack_270 = (short)extraout_XMM0_Qb_01;
          sStack_26e = (short)((ulong)extraout_XMM0_Qb_01 >> 0x10);
          sStack_26c = (short)((ulong)extraout_XMM0_Qb_01 >> 0x20);
          sStack_26a = (short)((ulong)extraout_XMM0_Qb_01 >> 0x30);
          in_stack_fffffffffffffa88 =
               (0 < local_278) * (local_278 < 0x100) * (char)extraout_XMM0_Qa_01 -
               (0xff < local_278);
          cVar6 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x10);
          in_stack_fffffffffffffa89 =
               (0 < sStack_276) * (sStack_276 < 0x100) * cVar6 - (0xff < sStack_276);
          cVar7 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x20);
          in_stack_fffffffffffffa8a =
               (0 < sStack_274) * (sStack_274 < 0x100) * cVar7 - (0xff < sStack_274);
          cVar8 = (char)((ulong)extraout_XMM0_Qa_01 >> 0x30);
          in_stack_fffffffffffffa8b =
               (0 < sStack_272) * (sStack_272 < 0x100) * cVar8 - (0xff < sStack_272);
          in_stack_fffffffffffffa8c =
               (0 < sStack_270) * (sStack_270 < 0x100) * (char)extraout_XMM0_Qb_01 -
               (0xff < sStack_270);
          cVar9 = (char)((ulong)extraout_XMM0_Qb_01 >> 0x10);
          in_stack_fffffffffffffa8d =
               (0 < sStack_26e) * (sStack_26e < 0x100) * cVar9 - (0xff < sStack_26e);
          cVar10 = (char)((ulong)extraout_XMM0_Qb_01 >> 0x20);
          in_stack_fffffffffffffa8e =
               (0 < sStack_26c) * (sStack_26c < 0x100) * cVar10 - (0xff < sStack_26c);
          cVar11 = (char)((ulong)extraout_XMM0_Qb_01 >> 0x30);
          in_stack_fffffffffffffa8f =
               (0 < sStack_26a) * (sStack_26a < 0x100) * cVar11 - (0xff < sStack_26a);
          cVar1 = (0 < local_278) * (local_278 < 0x100) * (char)extraout_XMM0_Qa_01 -
                  (0xff < local_278);
          cVar2 = (0 < sStack_276) * (sStack_276 < 0x100) * cVar6 - (0xff < sStack_276);
          cVar3 = (0 < sStack_274) * (sStack_274 < 0x100) * cVar7 - (0xff < sStack_274);
          cVar4 = (0 < sStack_272) * (sStack_272 < 0x100) * cVar8 - (0xff < sStack_272);
          cVar5 = (0 < sStack_270) * (sStack_270 < 0x100) * (char)extraout_XMM0_Qb_01 -
                  (0xff < sStack_270);
          cVar6 = (0 < sStack_26e) * (sStack_26e < 0x100) * cVar9 - (0xff < sStack_26e);
          cVar8 = (0 < sStack_26c) * (sStack_26c < 0x100) * cVar10 - (0xff < sStack_26c);
          cVar7 = (0 < sStack_26a) * (sStack_26a < 0x100) * cVar11 - (0xff < sStack_26a);
          if (local_358 < 5) {
            uVar12 = CONCAT13(in_stack_fffffffffffffa8b,
                              CONCAT12(in_stack_fffffffffffffa8a,
                                       CONCAT11(in_stack_fffffffffffffa89,in_stack_fffffffffffffa88)
                                      ));
            local_248 = CONCAT17(in_stack_fffffffffffffa8f,
                                 CONCAT16(in_stack_fffffffffffffa8e,
                                          CONCAT15(in_stack_fffffffffffffa8d,
                                                   CONCAT14(in_stack_fffffffffffffa8c,uVar12))));
            uStack_240 = CONCAT17(cVar7,CONCAT16(cVar8,CONCAT15(cVar6,CONCAT14(cVar5,CONCAT13(cVar4,
                                                  CONCAT12(cVar3,CONCAT11(cVar2,cVar1)))))));
            *(undefined4 *)(local_350 + local_3a0) = uVar12;
            local_238 = local_248;
            uStack_230 = uStack_240;
          }
          else {
            local_218 = (undefined8 *)(local_350 + local_3a0);
            local_228 = CONCAT17(in_stack_fffffffffffffa8f,
                                 CONCAT16(in_stack_fffffffffffffa8e,
                                          CONCAT15(in_stack_fffffffffffffa8d,
                                                   CONCAT14(in_stack_fffffffffffffa8c,
                                                            CONCAT13(in_stack_fffffffffffffa8b,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffffa8a,
                                                  CONCAT11(in_stack_fffffffffffffa89,
                                                           in_stack_fffffffffffffa88)))))));
            uStack_220 = CONCAT17(cVar7,CONCAT16(cVar8,CONCAT15(cVar6,CONCAT14(cVar5,CONCAT13(cVar4,
                                                  CONCAT12(cVar3,CONCAT11(cVar2,cVar1)))))));
            *local_218 = local_228;
          }
        }
      }
      local_340 = local_340 + local_344;
      local_368 = local_368 + (long)local_36c * 2;
      local_350 = local_350 + local_354;
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_copy_sse2(const uint8_t *src, int src_stride,
                                        uint8_t *dst0, int dst_stride0, int w,
                                        int h, ConvolveParams *conv_params) {
  const int bd = 8;
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;

  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const __m128i zero = _mm_setzero_si128();
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  int i, j;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi16(w0);
  const __m128i wt1 = _mm_set1_epi16(w1);
  const __m128i wt = _mm_unpacklo_epi16(wt0, wt1);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi16((1 << rounding_shift) >> 1);

  assert((w % 4) == 0);

  if (!(w % 16)) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 16) {
        const __m128i d8 = _mm_loadu_si128((__m128i *)&src[j]);

        const __m128i d16_lo = _mm_unpacklo_epi8(d8, zero);
        const __m128i d16_hi = _mm_unpackhi_epi8(d8, zero);

        const __m128i res_lo = _mm_sll_epi16(d16_lo, left_shift);
        const __m128i res_unsigned_lo = _mm_add_epi16(res_lo, offset_const);

        const __m128i res_hi = _mm_sll_epi16(d16_hi, left_shift);
        const __m128i res_unsigned_hi = _mm_add_epi16(res_hi, offset_const);

        if (do_average) {
          const __m128i data_ref_0_lo = _mm_loadu_si128((__m128i *)(&dst[j]));
          const __m128i data_ref_0_hi =
              _mm_loadu_si128((__m128i *)(&dst[j + 8]));

          const __m128i comp_avg_res_lo = comp_avg(
              &data_ref_0_lo, &res_unsigned_lo, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result_lo = convolve_rounding(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);

          const __m128i comp_avg_res_hi = comp_avg(
              &data_ref_0_hi, &res_unsigned_hi, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result_hi = convolve_rounding(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 =
              _mm_packus_epi16(round_result_lo, round_result_hi);

          _mm_store_si128((__m128i *)(&dst0[j]), res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[j]), res_unsigned_lo);
          _mm_store_si128((__m128i *)(&dst[j + 8]), res_unsigned_hi);
        }
      }
      src += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;
    }
  } else {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i d8 = _mm_loadl_epi64((__m128i *)&src[j]);
        const __m128i d16_0 = _mm_unpacklo_epi8(d8, zero);

        const __m128i res = _mm_sll_epi16(d16_0, left_shift);
        const __m128i res_unsigned = _mm_add_epi16(res, offset_const);

        if (do_average) {
          const __m128i data_ref_0 = _mm_loadu_si128((__m128i *)(&dst[j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);

          if (w > 4)
            _mm_storel_epi64((__m128i *)(&dst0[j]), res_8);
          else
            *(int *)(&dst0[j]) = _mm_cvtsi128_si32(res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[j]), res_unsigned);
        }
      }
      src += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;
    }
  }
}